

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_syms.c
# Opt level: O0

_Bool gen_iosym(int K,int T,int n_ESIs,uint32_t *ESIs)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  undefined4 in_EDI;
  size_t out_written;
  int RUN_NOFAIL__err_5;
  size_t outdata_sz;
  size_t ret;
  size_t indata_sz;
  int RUN_NOFAIL__err_4;
  int RUN_NOFAIL__err_3;
  int i;
  int RUN_NOFAIL__err_2;
  int RUN_NOFAIL__err_1;
  int RUN_NOFAIL__err;
  size_t inter_sym_num;
  size_t prog_sz;
  size_t work_sz;
  void *outdata;
  void *indata;
  RqOutProgram *prog;
  RqOutWorkMem *wrk;
  _Bool success;
  int local_68;
  long local_58;
  size_t local_50;
  size_t local_48;
  void *local_40;
  void *local_38;
  void *local_30;
  void *local_28;
  byte local_19;
  long local_18;
  int local_c;
  int local_8;
  undefined4 local_4;
  
  local_19 = 0;
  local_28 = (void *)0x0;
  local_30 = (void *)0x0;
  local_38 = (void *)0x0;
  local_40 = (void *)0x0;
  local_18 = in_RCX;
  local_c = in_EDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  uVar1 = RqInterGetMemSizes(in_EDI,0,0,0,&local_58);
  if (uVar1 == 0) {
    uVar1 = RqOutGetMemSizes(local_c,&local_48,&local_50);
    if (uVar1 == 0) {
      local_28 = malloc(local_48);
      local_30 = malloc(local_50);
      uVar1 = RqOutInit(local_4,local_28,local_48);
      if (uVar1 == 0) {
        for (local_68 = 0; local_68 < local_c; local_68 = local_68 + 1) {
          uVar1 = RqOutAddIds(local_28,*(undefined4 *)(local_18 + (long)local_68 * 4),1);
          if (uVar1 != 0) {
            fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
                    ,0x84,"RqOutAddIds(wrk, ESIs[i], 1)",(ulong)uVar1);
            goto LAB_00101a77;
          }
        }
        uVar1 = RqOutCompile(local_28,local_30,local_50);
        if (uVar1 == 0) {
          sVar2 = local_8 * local_58;
          local_38 = malloc(sVar2);
          sVar3 = fread(local_38,1,sVar2,_stdin);
          if (sVar3 == sVar2) {
            sVar2 = (size_t)(local_8 * local_c);
            local_40 = malloc(sVar2);
            uVar1 = RqOutExecute(local_30,(long)local_8,local_38,local_40,sVar2);
            if (uVar1 == 0) {
              sVar3 = fwrite(local_40,1,sVar2,_stdout);
              if (sVar3 == sVar2) {
                local_19 = 1;
              }
              else {
                fprintf(_stderr,"Error:  fwrite() returned a short count.\n");
              }
            }
            else {
              fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
                      ,0x93,"RqOutExecute(prog, T, indata, outdata, outdata_sz)",(ulong)uVar1);
            }
          }
          else {
            fprintf(_stderr,"Error:  fread() returned a short count.\n");
          }
        }
        else {
          fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
                  ,0x85,"RqOutCompile(wrk, prog, prog_sz)",(ulong)uVar1);
        }
      }
      else {
        fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
                ,0x82,"RqOutInit(K, wrk, work_sz)",(ulong)uVar1);
      }
    }
    else {
      fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
              ,0x7e,"RqOutGetMemSizes(n_ESIs, &work_sz, &prog_sz)",(ulong)uVar1);
    }
  }
  else {
    fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
            ,0x7b,"RqInterGetMemSizes(K, 0, ((void*)0), ((void*)0), &inter_sym_num)",(ulong)uVar1);
  }
LAB_00101a77:
  if (local_40 != (void *)0x0) {
    free(local_40);
  }
  if (local_38 != (void *)0x0) {
    free(local_38);
  }
  if (local_30 != (void *)0x0) {
    free(local_30);
  }
  if (local_28 != (void *)0x0) {
    free(local_28);
  }
  return (_Bool)(local_19 & 1);
}

Assistant:

bool gen_iosym(int K, int T, int n_ESIs, uint32_t* ESIs)
{
	bool success = false;

	RqOutWorkMem* wrk = NULL;
	RqOutProgram* prog = NULL;
	void* indata = NULL;
	void* outdata = NULL;

	size_t work_sz, prog_sz, inter_sym_num;
	RUN_NOFAIL(RqInterGetMemSizes(K, 0, NULL, NULL, &inter_sym_num), xit);
	RUN_NOFAIL(RqOutGetMemSizes(n_ESIs,
				&work_sz,
				&prog_sz), xit);
	wrk = malloc(work_sz);
	prog = malloc(prog_sz);

	RUN_NOFAIL(RqOutInit(K, wrk, work_sz), xit);
	for (int i = 0; i < n_ESIs; ++i)
		RUN_NOFAIL(RqOutAddIds(wrk, ESIs[i], 1), xit);
	RUN_NOFAIL(RqOutCompile(wrk, prog, prog_sz), xit);

	/* Read source data */
	size_t indata_sz = T * (size_t)inter_sym_num;
	indata = malloc(indata_sz);
	size_t ret = fread(indata, 1, indata_sz, stdin);
	if (ret != indata_sz) {
		fprintf(stderr, "Error:  fread() returned a short count.\n");
		goto xit;
	}

	/* Generate iblock data */
	size_t outdata_sz = T * n_ESIs;
	outdata = malloc(outdata_sz);
	RUN_NOFAIL(RqOutExecute(prog, T, indata, outdata, outdata_sz), xit);

	/* Print them to stdout */
	size_t out_written = fwrite(outdata, 1, outdata_sz, stdout);
	if (out_written != outdata_sz) {
		fprintf(stderr, "Error:  fwrite() returned a short count.\n");
		goto xit;
	}

	success = true;
xit:
	if (outdata)		free(outdata);
	if (indata)		free(indata);
	if (prog)		free(prog);
	if (wrk)		free(wrk);
	return success;
}